

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

index_t __thiscall GEO::Delaunay3d::new_tetrahedron(Delaunay3d *this)

{
  index_t iVar1;
  int *piVar2;
  value_type_conflict local_20 [3];
  index_t local_14;
  Delaunay3d *pDStack_10;
  index_t result;
  Delaunay3d *this_local;
  
  pDStack_10 = this;
  if (this->first_free_ == 0x7fffffff) {
    iVar1 = vector<int>::size(&this->cell_to_v_store_);
    local_20[2] = 0xffffffff;
    std::vector<int,_GEO::Memory::aligned_allocator<int,_64>_>::resize
              (&(this->cell_to_v_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>
               ,(ulong)(iVar1 + 4),(value_type_conflict1 *)(local_20 + 2));
    iVar1 = vector<int>::size(&this->cell_to_cell_store_);
    local_20[1] = 0xffffffff;
    std::vector<int,_GEO::Memory::aligned_allocator<int,_64>_>::resize
              (&(this->cell_to_cell_store_).
                super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>,(ulong)(iVar1 + 4),
               (value_type_conflict1 *)(local_20 + 1));
    local_20[0] = 0xffffffff;
    std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::push_back
              (&(this->cell_next_).
                super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>,
               local_20);
    local_14 = max_t(this);
    local_14 = local_14 - 1;
  }
  else {
    local_14 = this->first_free_;
    iVar1 = tet_next(this,this->first_free_);
    this->first_free_ = iVar1;
    remove_tet_from_list(this,local_14);
  }
  piVar2 = vector<int>::operator[](&this->cell_to_cell_store_,local_14 << 2);
  *piVar2 = -1;
  piVar2 = vector<int>::operator[](&this->cell_to_cell_store_,local_14 * 4 + 1);
  *piVar2 = -1;
  piVar2 = vector<int>::operator[](&this->cell_to_cell_store_,local_14 * 4 + 2);
  *piVar2 = -1;
  piVar2 = vector<int>::operator[](&this->cell_to_cell_store_,local_14 * 4 + 3);
  *piVar2 = -1;
  return local_14;
}

Assistant:

index_t new_tetrahedron() {
            index_t result;
            if(first_free_ == END_OF_LIST) {
                cell_to_v_store_.resize(cell_to_v_store_.size() + 4, -1);
                cell_to_cell_store_.resize(cell_to_cell_store_.size() + 4, -1);
                // index_t(NOT_IN_LIST) is necessary, else with
                // NOT_IN_LIST alone the compiler tries to generate a
                // reference to NOT_IN_LIST resulting in a link error.
                cell_next_.push_back(index_t(NOT_IN_LIST));
                result = max_t() - 1;
            } else {
                result = first_free_;
                first_free_ = tet_next(first_free_);
                remove_tet_from_list(result);
            }

            cell_to_cell_store_[4 * result] = -1;
            cell_to_cell_store_[4 * result + 1] = -1;
            cell_to_cell_store_[4 * result + 2] = -1;
            cell_to_cell_store_[4 * result + 3] = -1;

            return result;
        }